

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

BuilderFor<DynamicCapability> *
capnp::DynamicValue::Builder::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (BuilderFor<DynamicCapability> *__return_storage_ptr__,Builder *builder)

{
  Fault local_20;
  Fault f;
  Builder *builder_local;
  
  f.exception = (Exception *)builder;
  if (builder->type == CAPABILITY) {
    DynamicCapability::Client::Client(__return_storage_ptr__,&(builder->field_1).capabilityValue);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x724,FAILED,"builder.type == CAPABILITY","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x0;
    DynamicCapability::Client::Client(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

BuilderFor<DynamicCapability> DynamicValue::Builder::AsImpl<DynamicCapability>::apply(
    Builder& builder) {
  KJ_REQUIRE(builder.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return builder.capabilityValue;
}